

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O1

unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> __thiscall
spoa::SisdAlignmentEngine::Create
          (SisdAlignmentEngine *this,AlignmentType type,AlignmentSubtype subtype,int8_t m,int8_t n,
          int8_t g,int8_t e,int8_t q,int8_t c)

{
  AlignmentEngine *this_00;
  _func_int **pp_Var1;
  int8_t c_00;
  
  c_00 = 'f';
  this_00 = (AlignmentEngine *)operator_new(0x20);
  AlignmentEngine::AlignmentEngine(this_00,type,subtype,m,n,g,q,c,c_00);
  this_00->_vptr_AlignmentEngine = (_func_int **)&PTR__SisdAlignmentEngine_0011fd38;
  pp_Var1 = (_func_int **)operator_new(0x70);
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  this_00[1]._vptr_AlignmentEngine = pp_Var1;
  (this->super_AlignmentEngine)._vptr_AlignmentEngine = (_func_int **)this_00;
  return (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
          )(__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AlignmentEngine> SisdAlignmentEngine::Create(
    AlignmentType type,
    AlignmentSubtype subtype,
    std::int8_t m,
    std::int8_t n,
    std::int8_t g,
    std::int8_t e,
    std::int8_t q,
    std::int8_t c) {
  return std::unique_ptr<AlignmentEngine>(
      new SisdAlignmentEngine(type, subtype, m, n, g, e, q, c));
}